

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O3

bool __thiscall tinyusdz::value::TimeSamples::has_sample_at(TimeSamples *this,double t)

{
  pointer pSVar1;
  pointer pSVar2;
  pointer pSVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  
  if (this->_dirty == true) {
    update(this);
  }
  pSVar3 = (this->_samples).
           super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pSVar1 = (this->_samples).
           super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)pSVar1 - (long)pSVar3;
  lVar4 = (lVar5 >> 3) * -0x3333333333333333 >> 2;
  if (0 < lVar4) {
    dVar10 = ABS(t);
    lVar5 = lVar4 + 1;
    pSVar2 = pSVar3 + 2;
    uVar6 = -(ulong)NAN(dVar10);
    do {
      dVar8 = ABS(t - pSVar2[-2].t);
      if (dVar8 <= 2.220446049250313e-16) {
LAB_002a6310:
        pSVar2 = pSVar2 + -2;
        goto LAB_002a6320;
      }
      dVar9 = ABS(pSVar2[-2].t);
      dVar7 = dVar9;
      if (dVar9 <= dVar10) {
        dVar7 = dVar10;
      }
      if (dVar8 <= (double)(~uVar6 & (ulong)dVar7 | uVar6 & (ulong)dVar9) * 2.220446049250313e-16)
      goto LAB_002a6310;
      dVar8 = ABS(t - pSVar2[-1].t);
      if (dVar8 <= 2.220446049250313e-16) {
LAB_002a6316:
        pSVar2 = pSVar2 + -1;
        goto LAB_002a6320;
      }
      dVar9 = ABS(pSVar2[-1].t);
      dVar7 = dVar9;
      if (dVar9 <= dVar10) {
        dVar7 = dVar10;
      }
      if (dVar8 <= (double)(~uVar6 & (ulong)dVar7 | uVar6 & (ulong)dVar9) * 2.220446049250313e-16)
      goto LAB_002a6316;
      dVar8 = ABS(t - pSVar2->t);
      if (dVar8 <= 2.220446049250313e-16) goto LAB_002a6320;
      dVar9 = ABS(pSVar2->t);
      dVar7 = dVar9;
      if (dVar9 <= dVar10) {
        dVar7 = dVar10;
      }
      if (dVar8 <= (double)(~uVar6 & (ulong)dVar7 | uVar6 & (ulong)dVar9) * 2.220446049250313e-16)
      goto LAB_002a6320;
      dVar8 = ABS(t - pSVar2[1].t);
      if (dVar8 <= 2.220446049250313e-16) {
LAB_002a631c:
        pSVar2 = pSVar2 + 1;
        goto LAB_002a6320;
      }
      dVar9 = ABS(pSVar2[1].t);
      dVar7 = dVar9;
      if (dVar9 <= dVar10) {
        dVar7 = dVar10;
      }
      if (dVar8 <= (double)(~uVar6 & (ulong)dVar7 | uVar6 & (ulong)dVar9) * 2.220446049250313e-16)
      goto LAB_002a631c;
      lVar5 = lVar5 + -1;
      pSVar2 = pSVar2 + 4;
    } while (1 < lVar5);
    lVar5 = (long)pSVar1 - (long)(pSVar3 + lVar4 * 4);
    pSVar3 = pSVar3 + lVar4 * 4;
  }
  lVar4 = (lVar5 >> 3) * -0x3333333333333333;
  if (lVar4 != 1) {
    pSVar2 = pSVar3;
    if (lVar4 != 2) {
      pSVar2 = pSVar1;
      if (lVar4 != 3) goto LAB_002a6320;
      dVar10 = ABS(t - pSVar3->t);
      pSVar2 = pSVar3;
      if (dVar10 <= 2.220446049250313e-16) goto LAB_002a6320;
      dVar9 = ABS(t);
      dVar7 = ABS(pSVar3->t);
      dVar8 = dVar7;
      if (dVar7 <= dVar9) {
        dVar8 = dVar9;
      }
      if (dVar10 <= (double)(~-(ulong)NAN(dVar9) & (ulong)dVar8 | -(ulong)NAN(dVar9) & (ulong)dVar7)
                    * 2.220446049250313e-16) goto LAB_002a6320;
      pSVar2 = pSVar3 + 1;
    }
    dVar10 = ABS(t - pSVar2->t);
    if (dVar10 <= 2.220446049250313e-16) goto LAB_002a6320;
    dVar9 = ABS(t);
    dVar7 = ABS(pSVar2->t);
    dVar8 = dVar7;
    if (dVar7 <= dVar9) {
      dVar8 = dVar9;
    }
    if (dVar10 <= (double)(~-(ulong)NAN(dVar9) & (ulong)dVar8 | -(ulong)NAN(dVar9) & (ulong)dVar7) *
                  2.220446049250313e-16) goto LAB_002a6320;
    pSVar3 = pSVar2 + 1;
  }
  dVar10 = ABS(t - pSVar3->t);
  pSVar2 = pSVar3;
  if (2.220446049250313e-16 < dVar10) {
    dVar7 = ABS(t);
    dVar9 = ABS(pSVar3->t);
    dVar8 = dVar9;
    if (dVar9 <= dVar7) {
      dVar8 = dVar7;
    }
    if ((double)(~-(ulong)NAN(dVar7) & (ulong)dVar8 | -(ulong)NAN(dVar7) & (ulong)dVar9) *
        2.220446049250313e-16 < dVar10) {
      pSVar2 = pSVar1;
    }
  }
LAB_002a6320:
  return pSVar2 != pSVar1;
}

Assistant:

bool TimeSamples::has_sample_at(const double t) const {
  if (_dirty) {
    update();
  }

  const auto it = std::find_if(_samples.begin(), _samples.end(), [&t](const Sample &s) {
    return math::is_close(t, s.t);
  });

  return (it != _samples.end());
}